

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mojoshader_preprocessor.c
# Opt level: O0

void handle_pp_undef(Context_conflict1 *ctx)

{
  uint uVar1;
  void *__src;
  long lVar2;
  Define *pDVar3;
  long lVar4;
  char *pcVar5;
  IncludeState *pIVar6;
  Token TVar7;
  int iVar8;
  undefined8 uStack_30;
  char acStack_28 [8];
  char *local_20;
  char *sym;
  IncludeState *state;
  Context_conflict1 *ctx_local;
  
  sym = (char *)ctx->include_stack;
  uStack_30 = 0x150584;
  state = (IncludeState *)ctx;
  TVar7 = lexer((IncludeState *)sym);
  if (TVar7 == TOKEN_IDENTIFIER) {
    lVar4 = -((ulong)(*(int *)(sym + 0x20) + 1) + 0xf & 0xfffffffffffffff0);
    __src = *(void **)(sym + 0x18);
    uVar1 = *(uint *)(sym + 0x20);
    local_20 = acStack_28 + lVar4;
    *(undefined8 *)((long)&uStack_30 + lVar4) = 0x1505da;
    memcpy(acStack_28 + lVar4,__src,(ulong)uVar1);
    pcVar5 = sym;
    local_20[*(uint *)(sym + 0x20)] = '\0';
    *(undefined8 *)((long)&uStack_30 + lVar4) = 0x1505f2;
    iVar8 = require_newline((IncludeState *)pcVar5);
    pIVar6 = state;
    pcVar5 = local_20;
    if (iVar8 == 0) {
      *(undefined8 *)((long)&uStack_30 + lVar4) = 0x150607;
      fail((Context_conflict1 *)pIVar6,"Invalid #undef directive");
    }
    else {
      *(undefined8 *)((long)&uStack_30 + lVar4) = 0x15061c;
      iVar8 = strcmp(pcVar5,"__FILE__");
      pIVar6 = state;
      pcVar5 = local_20;
      if (iVar8 == 0) {
        lVar2._0_4_ = state[0x16].bytes_left;
        lVar2._4_4_ = state[0x16].line;
        if (lVar2 != 0) {
          *(undefined8 *)((long)&uStack_30 + lVar4) = 0x150645;
          failf((Context_conflict1 *)pIVar6,"undefining \"%s\"",pcVar5);
          pIVar6 = state;
          pDVar3 = *(Define **)&state[0x16].bytes_left;
          *(undefined8 *)((long)&uStack_30 + lVar4) = 0x150659;
          free_define((Context_conflict1 *)pIVar6,pDVar3);
          state[0x16].bytes_left = 0;
          state[0x16].line = 0;
        }
      }
      else {
        *(undefined8 *)((long)&uStack_30 + lVar4) = 0x15067a;
        iVar8 = strcmp(pcVar5,"__LINE__");
        pIVar6 = state;
        pcVar5 = local_20;
        if ((iVar8 == 0) && (state[0x16].conditional_stack != (Conditional *)0x0)) {
          *(undefined8 *)((long)&uStack_30 + lVar4) = 0x1506a3;
          failf((Context_conflict1 *)pIVar6,"undefining \"%s\"",pcVar5);
          pIVar6 = state;
          pDVar3 = (Define *)state[0x16].conditional_stack;
          *(undefined8 *)((long)&uStack_30 + lVar4) = 0x1506b7;
          free_define((Context_conflict1 *)pIVar6,pDVar3);
          state[0x16].conditional_stack = (Conditional *)0x0;
        }
      }
      pIVar6 = state;
      pcVar5 = local_20;
      *(undefined8 *)((long)&uStack_30 + lVar4) = 0x1506d7;
      remove_define((Context_conflict1 *)pIVar6,pcVar5);
    }
  }
  else {
    uStack_30 = 0x15059b;
    fail((Context_conflict1 *)state,"Macro names must be indentifiers");
  }
  return;
}

Assistant:

static void handle_pp_undef(Context *ctx)
{
    IncludeState *state = ctx->include_stack;

    if (lexer(state) != TOKEN_IDENTIFIER)
    {
        fail(ctx, "Macro names must be indentifiers");
        return;
    } // if

    char *sym = (char *) alloca(state->tokenlen+1);
    memcpy(sym, state->token, state->tokenlen);
    sym[state->tokenlen] = '\0';

    if (!require_newline(state))
    {
        fail(ctx, "Invalid #undef directive");
        return;
    } // if

    if (strcmp(sym, "__FILE__") == 0)
    {
        if (ctx->file_macro)
        {
            failf(ctx, "undefining \"%s\"", sym);  // !!! FIXME: should be warning.
            free_define(ctx, ctx->file_macro);
            ctx->file_macro = NULL;
        } // if
    } // if
    else if (strcmp(sym, "__LINE__") == 0)
    {
        if (ctx->line_macro)
        {
            failf(ctx, "undefining \"%s\"", sym);  // !!! FIXME: should be warning.
            free_define(ctx, ctx->line_macro);
            ctx->line_macro = NULL;
        } // if
    } // if

    remove_define(ctx, sym);
}